

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFileSpecObjectHelper.cc
# Opt level: O2

QPDFFileSpecObjectHelper * __thiscall
QPDFFileSpecObjectHelper::setDescription(QPDFFileSpecObjectHelper *this,string *desc)

{
  allocator<char> local_51;
  QPDFObjectHandle local_50;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_40;
  string local_30;
  
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
             &(this->super_QPDFObjectHelper).super_BaseHandle);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"/Desc",&local_51);
  QPDFObjectHandle::newUnicodeString(&local_50,desc);
  QPDFObjectHandle::replaceKey((QPDFObjectHandle *)&local_40,&local_30,&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_50.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  return this;
}

Assistant:

QPDFFileSpecObjectHelper&
QPDFFileSpecObjectHelper::setDescription(std::string const& desc)
{
    oh().replaceKey("/Desc", QPDFObjectHandle::newUnicodeString(desc));
    return *this;
}